

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfuturewatcher.cpp
# Opt level: O2

void QFutureWatcherBase::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                      ((QtMocHelpers *)_a,(void **)started,0,0);
    if ((((((!bVar1) &&
           (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                              ((QtMocHelpers *)_a,(void **)finished,0,1), !bVar1)) &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                             ((QtMocHelpers *)_a,(void **)canceled,0,2), !bVar1)) &&
         ((bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                             ((QtMocHelpers *)_a,(void **)paused,0,3), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                             ((QtMocHelpers *)_a,(void **)suspending,0,4), !bVar1)))) &&
        ((bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                            ((QtMocHelpers *)_a,(void **)suspended,0,5), !bVar1 &&
         ((bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)()>
                             ((QtMocHelpers *)_a,(void **)resumed,0,6), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(int)>
                             ((QtMocHelpers *)_a,(void **)resultReadyAt,0,7), !bVar1)))))) &&
       ((bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(int,int)>
                           ((QtMocHelpers *)_a,(void **)resultsReadyAt,0,8), !bVar1 &&
        ((bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(int,int)>
                            ((QtMocHelpers *)_a,(void **)progressRangeChanged,0,9), !bVar1 &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(int)>
                            ((QtMocHelpers *)_a,(void **)progressValueChanged,0,10), !bVar1)))))) {
      QtMocHelpers::indexOfMethod<void(QFutureWatcherBase::*)(QString_const&)>
                ((QtMocHelpers *)_a,(void **)progressTextChanged,0,0xb);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      started((QFutureWatcherBase *)_o);
      return;
    case 1:
      finished((QFutureWatcherBase *)_o);
      return;
    case 2:
      canceled((QFutureWatcherBase *)_o);
      return;
    case 3:
      paused((QFutureWatcherBase *)_o);
      return;
    case 4:
      suspending((QFutureWatcherBase *)_o);
      return;
    case 5:
      suspended((QFutureWatcherBase *)_o);
      return;
    case 6:
      resumed((QFutureWatcherBase *)_o);
      return;
    case 7:
      resultReadyAt((QFutureWatcherBase *)_o,*_a[1]);
      return;
    case 8:
      resultsReadyAt((QFutureWatcherBase *)_o,*_a[1],*_a[2]);
      return;
    case 9:
      progressRangeChanged((QFutureWatcherBase *)_o,*_a[1],*_a[2]);
      return;
    case 10:
      progressValueChanged((QFutureWatcherBase *)_o,*_a[1]);
      return;
    case 0xb:
      progressTextChanged((QFutureWatcherBase *)_o,(QString *)_a[1]);
      return;
    case 0xc:
      cancel((QFutureWatcherBase *)_o);
      return;
    case 0xd:
      setSuspended((QFutureWatcherBase *)_o,*_a[1]);
      return;
    case 0xe:
      suspend((QFutureWatcherBase *)_o);
      return;
    case 0xf:
      resume((QFutureWatcherBase *)_o);
      return;
    case 0x10:
      toggleSuspended((QFutureWatcherBase *)_o);
      return;
    case 0x11:
      setPaused((QFutureWatcherBase *)_o,*_a[1]);
      return;
    case 0x12:
      pause((QFutureWatcherBase *)_o);
      return;
    case 0x13:
      togglePaused((QFutureWatcherBase *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QFutureWatcherBase::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFutureWatcherBase *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(); break;
        case 1: _t->finished(); break;
        case 2: _t->canceled(); break;
        case 3: _t->paused(); break;
        case 4: _t->suspending(); break;
        case 5: _t->suspended(); break;
        case 6: _t->resumed(); break;
        case 7: _t->resultReadyAt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->resultsReadyAt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 9: _t->progressRangeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->progressValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->progressTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: _t->cancel(); break;
        case 13: _t->setSuspended((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->suspend(); break;
        case 15: _t->resume(); break;
        case 16: _t->toggleSuspended(); break;
        case 17: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 18: _t->pause(); break;
        case 19: _t->togglePaused(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::finished, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::canceled, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::paused, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::suspending, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::suspended, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)()>(_a, &QFutureWatcherBase::resumed, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int )>(_a, &QFutureWatcherBase::resultReadyAt, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int , int )>(_a, &QFutureWatcherBase::resultsReadyAt, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int , int )>(_a, &QFutureWatcherBase::progressRangeChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(int )>(_a, &QFutureWatcherBase::progressValueChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFutureWatcherBase::*)(const QString & )>(_a, &QFutureWatcherBase::progressTextChanged, 11))
            return;
    }
}